

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Sched.c
# Opt level: O0

void Llb_MtrSchedule(Llb_Mtr_t *p)

{
  int iCol;
  int local_1c;
  int i;
  int iGrpBest;
  int iGrp;
  Llb_Mtr_t *p_local;
  
  for (local_1c = 0; local_1c < p->nRows; local_1c = local_1c + 1) {
    if ((local_1c < p->nPis) || (p->nPis + p->nFfs <= local_1c)) {
      p->pProdVars[local_1c] = '\0';
      p->pProdNums[local_1c] = p->pRowSums[local_1c];
    }
    else {
      p->pProdVars[local_1c] = '\x01';
      p->pProdNums[local_1c] = p->pRowSums[local_1c] + -1;
    }
  }
  Llb_MtrVerifyMatrix(p);
  for (i = 1; i < p->nCols + -1; i = i + 1) {
    Llb_MtrVerifyColumns(p,i);
    iCol = Llb_MtrFindBestColumn(p,i);
    Llb_MtrUseSelectedColumn(p,iCol);
    Llb_MtrSwapColumns(p,i,iCol);
  }
  Llb_MtrVerifyMatrix(p);
  return;
}

Assistant:

void Llb_MtrSchedule( Llb_Mtr_t * p )
{
    int iGrp, iGrpBest, i;
    // start partial product
    for ( i = 0; i < p->nRows; i++ )
    {
        if ( i >= p->nPis && i < p->nPis + p->nFfs )
        {
            p->pProdVars[i] = 1;
            p->pProdNums[i] = p->pRowSums[i] - 1;
        }
        else 
        {
            p->pProdVars[i] = 0;
            p->pProdNums[i] = p->pRowSums[i];
        }
    }
    // order the partitions
    Llb_MtrVerifyMatrix( p );
    for ( iGrp = 1; iGrp < p->nCols-1; iGrp++ )
    {
        Llb_MtrVerifyColumns( p, iGrp );
        iGrpBest = Llb_MtrFindBestColumn( p, iGrp );
        Llb_MtrUseSelectedColumn( p, iGrpBest );
        Llb_MtrSwapColumns( p, iGrp, iGrpBest );
    }
    Llb_MtrVerifyMatrix( p );
}